

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool __thiscall
FillableSigningProvider::GetPubKey
          (FillableSigningProvider *this,CKeyID *address,CPubKey *vchPubKeyOut)

{
  int iVar1;
  long in_FS_OFFSET;
  CKey key;
  CPubKey local_61;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  key.fCompressed = false;
  key.keydata._M_t.
  super___uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  .super__Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>,_true,_true>
        )(__uniq_ptr_impl<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
          )0x0;
  iVar1 = (*(this->super_SigningProvider)._vptr_SigningProvider[5])(this,address,&key);
  if (SUB41(iVar1,0) != false) {
    CKey::GetPubKey(&local_61,&key);
    memcpy(vchPubKeyOut,&local_61,0x41);
  }
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&key.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return SUB41(iVar1,0);
  }
  __stack_chk_fail();
}

Assistant:

bool FillableSigningProvider::GetPubKey(const CKeyID &address, CPubKey &vchPubKeyOut) const
{
    CKey key;
    if (!GetKey(address, key)) {
        return false;
    }
    vchPubKeyOut = key.GetPubKey();
    return true;
}